

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateMessageToPool
               (string_view name_prefix,Descriptor *message,Printer *printer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string_view s;
  string_view s_00;
  string_view s_01;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  FieldDescriptor *pFVar5;
  long lVar6;
  _anonymous_namespace_ *this;
  OneofDescriptor *pOVar7;
  Descriptor *message_00;
  EnumDescriptor *en;
  undefined1 uVar8;
  char *pcVar9;
  AlphaNum *a;
  FieldDescriptor *field;
  AlphaNum *a_00;
  FieldDescriptor *field_00;
  int i;
  int iVar10;
  FileDescriptor *in_R8;
  Descriptor *this_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view classname;
  string_view name_prefix_00;
  size_t in_stack_fffffffffffffe58;
  Printer *this_01;
  Printer *pPVar11;
  allocator<char> local_191;
  int local_190;
  int local_18c;
  Descriptor *local_188;
  AlphaNum local_180;
  string_view local_150;
  AlphaNum local_120;
  undefined1 local_f0 [32];
  AlphaNum local_d0;
  string local_a0;
  string class_name;
  string local_60;
  
  if (*(char *)(*(long *)(message + 0x20) + 0x53) == '\0') {
    if (name_prefix._M_len == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,"",&local_191);
    }
    else {
      local_d0.piece_._M_len = name_prefix._M_len;
      local_d0.piece_._M_str = name_prefix._M_str;
      local_150 = absl::lts_20240722::NullSafeStringView("\\");
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_f0,(AlphaNum *)(local_f0 + 0x20));
    }
    local_180.piece_._M_len = local_f0._8_8_;
    local_180.piece_._M_str = (char *)local_f0._0_8_;
    classname._M_str = *(char **)(message + 0x10);
    classname._M_len = **(size_t **)(message + 8);
    ReservedNamePrefix_abi_cxx11_(&local_a0,(php *)(*(size_t **)(message + 8))[1],classname,in_R8);
    local_120.piece_._M_len = local_a0._M_string_length;
    local_120.piece_._M_str = local_a0._M_dataplus._M_p;
    local_60._M_string_length = **(size_type **)(message + 8);
    local_60._M_dataplus._M_p = (pointer)(*(size_type **)(message + 8))[1];
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&class_name,&local_180,&local_120);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)local_f0);
    DescriptorFullName<google::protobuf::Descriptor>((string *)&local_180,message,true);
    text._M_str = 
    "$pool->addMessage(\'^message^\', \\Google\\Protobuf\\Internal\\^class_name^::class)\n";
    text._M_len = 0x4e;
    this_01 = printer;
    local_188 = message;
    io::Printer::Print<char[8],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,text,(char (*) [8])0x387816,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_180,
               (char (*) [11])0x3d77b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&class_name);
    pcVar9 = (char *)0x27040f;
    std::__cxx11::string::~string((string *)&local_180);
    *(long *)(printer + 0x68) = *(long *)(printer + 0x68) + *(long *)(printer + 0x58) * 2;
    for (iVar10 = 0; iVar10 < *(int *)(local_188 + 4); iVar10 = iVar10 + 1) {
      pFVar5 = Descriptor::field(local_188,iVar10);
      bVar4 = FieldDescriptor::is_map(pFVar5);
      uVar8 = SUB81(pcVar9,0);
      if (bVar4) {
        google::protobuf::FieldDescriptor::message_type();
        lVar6 = google::protobuf::Descriptor::map_key();
        google::protobuf::FieldDescriptor::message_type();
        this = (_anonymous_namespace_ *)google::protobuf::Descriptor::map_value();
        pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pFVar5 + 8)
        ;
        strlen((char *)(&FieldDescriptor::kTypeToName)[*(byte *)(lVar6 + 2)]);
        s._M_str = (char *)this_01;
        s._M_len = in_stack_fffffffffffffe58;
        absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(s);
        strlen((char *)(&FieldDescriptor::kTypeToName)[(byte)this[2]]);
        s_00._M_str = (char *)this_01;
        s_00._M_len = in_stack_fffffffffffffe58;
        absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(s_00);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_180,*(int *)(pFVar5 + 4));
        absl::lts_20240722::StrCat_abi_cxx11_((string *)&local_120,(lts_20240722 *)&local_180,a);
        (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_(&local_60,this,field,(bool)uVar8);
        pcVar9 = "field";
        text_00._M_str =
             "->map(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^key^, \\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n"
        ;
        text_00._M_len = 0x78;
        io::Printer::
        Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                  (this_01,text_00,(char (*) [6])0x2ece73,pbVar1,(char (*) [4])0x3e6982,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f0 + 0x20),(char (*) [6])0x3d285f,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150,
                   (char (*) [7])0x3f1d31,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120,
                   (char (*) [6])"other",&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)(local_f0 + 0x20));
      }
      else {
        pOVar7 = FieldDescriptor::real_containing_oneof(pFVar5);
        if (pOVar7 == (OneofDescriptor *)0x0) {
          (*(code *)(&DAT_003e6d10 + *(int *)(&DAT_003e6d10 + (ulong)((byte)pFVar5[1] >> 6) * 4)))()
          ;
          return;
        }
      }
    }
    iVar10 = 0;
    this_00 = local_188;
    while (iVar10 < *(int *)(this_00 + 0x7c)) {
      local_190 = iVar10;
      pOVar7 = Descriptor::oneof_decl(this_00,iVar10);
      text_01._M_str = "->oneof(^name^)\n";
      text_01._M_len = 0x10;
      pPVar11 = this_01;
      io::Printer::Print<char[5],std::__cxx11::string>
                (this_01,text_01,(char (*) [5])0x3f02df,
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pOVar7 + 8)
                );
      *(long *)(this_01 + 0x68) = *(long *)(this_01 + 0x68) + *(long *)(this_01 + 0x58) * 2;
      iVar10 = 0;
      while (iVar10 < *(int *)(pOVar7 + 4)) {
        local_18c = iVar10;
        pFVar5 = OneofDescriptor::field(pOVar7,iVar10);
        pbVar1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pFVar5 + 8)
        ;
        uVar8 = 0x10;
        strlen((char *)(&FieldDescriptor::kTypeToName)[(byte)pFVar5[2]]);
        s_01._M_str = (char *)pPVar11;
        s_01._M_len = in_stack_fffffffffffffe58;
        absl::lts_20240722::AsciiStrToUpper_abi_cxx11_(s_01);
        absl::lts_20240722::AlphaNum::AlphaNum(&local_180,*(int *)(pFVar5 + 4));
        absl::lts_20240722::StrCat_abi_cxx11_((string *)&local_150,(lts_20240722 *)&local_180,a_00);
        (anonymous_namespace)::EnumOrMessageSuffix_abi_cxx11_
                  ((string *)&local_120,(_anonymous_namespace_ *)pFVar5,field_00,(bool)uVar8);
        text_02._M_str =
             "->value(\'^field^\', \\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n"
        ;
        text_02._M_len = 0x4f;
        io::Printer::
        Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string,char[7],std::__cxx11::string,char[6],std::__cxx11::string>
                  (pPVar11,text_02,(char (*) [6])0x2ece73,pbVar1,(char (*) [5])0x3638b4,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f0 + 0x20),(char (*) [7])0x3f1d31,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150,
                   (char (*) [6])"other",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)(local_f0 + 0x20));
        this_00 = local_188;
        iVar10 = local_18c + 1;
      }
      text_03._M_str = "->finish()\n";
      text_03._M_len = 0xb;
      this_01 = pPVar11;
      io::Printer::Print<>(pPVar11,text_03);
      Outdent(pPVar11);
      iVar10 = local_190 + 1;
    }
    text_04._M_str = "->finalizeToPool();\n";
    text_04._M_len = 0x14;
    pPVar11 = this_01;
    io::Printer::Print<>(this_01,text_04);
    Outdent(this_01);
    text_05._M_str = "\n";
    text_05._M_len = 1;
    io::Printer::Print<>(this_01,text_05);
    for (iVar10 = 0; sVar3 = class_name._M_string_length, _Var2._M_p = class_name._M_dataplus._M_p,
        iVar10 < *(int *)(this_00 + 0x80); iVar10 = iVar10 + 1) {
      message_00 = Descriptor::nested_type(this_00,iVar10);
      name_prefix_00._M_str = _Var2._M_p;
      name_prefix_00._M_len = sVar3;
      GenerateMessageToPool(name_prefix_00,message_00,pPVar11);
    }
    for (iVar10 = 0; iVar10 < *(int *)(this_00 + 0x84); iVar10 = iVar10 + 1) {
      en = Descriptor::enum_type(this_00,iVar10);
      GenerateEnumToPool(en,pPVar11);
    }
    std::__cxx11::string::~string((string *)&class_name);
  }
  return;
}

Assistant:

void GenerateMessageToPool(absl::string_view name_prefix,
                           const Descriptor* message, io::Printer* printer) {
  // Don't generate MapEntry messages -- we use the PHP extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }
  std::string class_name = absl::StrCat(
      name_prefix.empty() ? "" : absl::StrCat(name_prefix, "\\"),
      ReservedNamePrefix(message->name(), message->file()), message->name());

  printer->Print(
      "$pool->addMessage('^message^', "
      "\\Google\\Protobuf\\Internal\\^class_name^::class)\n",
      "message", DescriptorFullName(message, true), "class_name", class_name);

  Indent(printer);

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->is_map()) {
      const FieldDescriptor* key = field->message_type()->map_key();
      const FieldDescriptor* val = field->message_type()->map_value();
      printer->Print(
          "->map('^field^', \\Google\\Protobuf\\Internal\\GPBType::^key^, "
          "\\Google\\Protobuf\\Internal\\GPBType::^value^, ^number^^other^)\n",
          "field", field->name(), "key",
          absl::AsciiStrToUpper(key->type_name()), "value",
          absl::AsciiStrToUpper(val->type_name()), "number",
          absl::StrCat(field->number()), "other",
          EnumOrMessageSuffix(val, true));
    } else if (!field->real_containing_oneof()) {
      printer->Print(
          "->^label^('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(), "label", LabelForField(field), "type",
          absl::AsciiStrToUpper(field->type_name()), "number",
          absl::StrCat(field->number()), "other",
          EnumOrMessageSuffix(field, true));
    }
  }

  // oneofs.
  for (int i = 0; i < message->real_oneof_decl_count(); i++) {
    const OneofDescriptor* oneof = message->oneof_decl(i);
    printer->Print("->oneof(^name^)\n", "name", oneof->name());
    Indent(printer);
    for (int index = 0; index < oneof->field_count(); index++) {
      const FieldDescriptor* field = oneof->field(index);
      printer->Print(
          "->value('^field^', "
          "\\Google\\Protobuf\\Internal\\GPBType::^type^, ^number^^other^)\n",
          "field", field->name(), "type",
          absl::AsciiStrToUpper(field->type_name()), "number",
          absl::StrCat(field->number()), "other",
          EnumOrMessageSuffix(field, true));
    }
    printer->Print("->finish()\n");
    Outdent(printer);
  }

  printer->Print("->finalizeToPool();\n");

  Outdent(printer);

  printer->Print("\n");

  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageToPool(class_name, message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumToPool(message->enum_type(i), printer);
  }
}